

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btree.h
# Opt level: O3

void __thiscall
absl::lts_20240722::container_internal::
btree_node<absl::lts_20240722::container_internal::map_params<std::__cxx11::string,google::protobuf::FileDescriptorProto_const*,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,google::protobuf::FileDescriptorProto_const*>>,256,false>>
::emplace_value<std::pair<std::__cxx11::string_const,google::protobuf::FileDescriptorProto_const*>>
          (btree_node<absl::lts_20240722::container_internal::map_params<std::__cxx11::string,google::protobuf::FileDescriptorProto_const*,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,google::protobuf::FileDescriptorProto_const*>>,256,false>>
           *this,field_type i,allocator_type *alloc,
          pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_google::protobuf::FileDescriptorProto_*>
          *args)

{
  byte bVar1;
  btree_node<absl::lts_20240722::container_internal::map_params<std::__cxx11::string,google::protobuf::FileDescriptorProto_const*,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,google::protobuf::FileDescriptorProto_const*>>,256,false>>
  bVar2;
  btree_node<absl::lts_20240722::container_internal::map_params<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_google::protobuf::FileDescriptorProto_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_google::protobuf::FileDescriptorProto_*>_>,_256,_false>_>
  *c;
  undefined7 in_register_00000031;
  uint uVar3;
  int iVar4;
  uint uVar5;
  uint uVar6;
  
  bVar1 = btree_node<absl::lts_20240722::container_internal::map_params<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_google::protobuf::FileDescriptorProto_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_google::protobuf::FileDescriptorProto_*>_>,_256,_false>_>
          ::start((btree_node<absl::lts_20240722::container_internal::map_params<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_google::protobuf::FileDescriptorProto_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_google::protobuf::FileDescriptorProto_*>_>,_256,_false>_>
                   *)this);
  if (i < bVar1) {
    __assert_fail("i >= start()",
                  "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O3/_deps/absl-src/absl/container/internal/btree.h"
                  ,0x709,
                  "void absl::container_internal::btree_node<absl::container_internal::map_params<std::basic_string<char>, const google::protobuf::FileDescriptorProto *, std::less<std::basic_string<char>>, std::allocator<std::pair<const std::basic_string<char>, const google::protobuf::FileDescriptorProto *>>, 256, false>>::emplace_value(const field_type, allocator_type *, Args &&...) [Params = absl::container_internal::map_params<std::basic_string<char>, const google::protobuf::FileDescriptorProto *, std::less<std::basic_string<char>>, std::allocator<std::pair<const std::basic_string<char>, const google::protobuf::FileDescriptorProto *>>, 256, false>, Args = <std::pair<const std::basic_string<char>, const google::protobuf::FileDescriptorProto *>>]"
                 );
  }
  if (((ulong)this & 7) != 0) {
    __assert_fail("reinterpret_cast<uintptr_t>(p) % alignment == 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O3/_deps/absl-src/absl/container/internal/layout.h"
                  ,0x1fe,
                  "CopyConst<Char, ElementType<N>> *absl::container_internal::internal_layout::LayoutImpl<std::tuple<absl::container_internal::btree_node<absl::container_internal::map_params<std::basic_string<char>, const google::protobuf::FileDescriptorProto *, std::less<std::basic_string<char>>, std::allocator<std::pair<const std::basic_string<char>, const google::protobuf::FileDescriptorProto *>>, 256, false>> *, unsigned int, unsigned char, absl::container_internal::map_slot_type<std::basic_string<char>, const google::protobuf::FileDescriptorProto *>, absl::container_internal::btree_node<absl::container_internal::map_params<std::basic_string<char>, const google::protobuf::FileDescriptorProto *, std::less<std::basic_string<char>>, std::allocator<std::pair<const std::basic_string<char>, const google::protobuf::FileDescriptorProto *>>, 256, false>> *>, std::integer_sequence<unsigned long, 1, 0, 4, 6, 7>, std::integer_sequence<unsigned long>, std::integer_sequence<unsigned long, 0, 1, 2, 3, 4>, std::integer_sequence<unsigned long, 0, 1, 2, 3, 4>>::Pointer(Char *) const [Elements = std::tuple<absl::container_internal::btree_node<absl::container_internal::map_params<std::basic_string<char>, const google::protobuf::FileDescriptorProto *, std::less<std::basic_string<char>>, std::allocator<std::pair<const std::basic_string<char>, const google::protobuf::FileDescriptorProto *>>, 256, false>> *, unsigned int, unsigned char, absl::container_internal::map_slot_type<std::basic_string<char>, const google::protobuf::FileDescriptorProto *>, absl::container_internal::btree_node<absl::container_internal::map_params<std::basic_string<char>, const google::protobuf::FileDescriptorProto *, std::less<std::basic_string<char>>, std::allocator<std::pair<const std::basic_string<char>, const google::protobuf::FileDescriptorProto *>>, 256, false>> *>, StaticSizeSeq = std::integer_sequence<unsigned long, 1, 0, 4, 6, 7>, RuntimeSizeSeq = std::integer_sequence<unsigned long>, SizeSeq = std::integer_sequence<unsigned long, 0, 1, 2, 3, 4>, OffsetSeq = std::integ..." /* TRUNCATED STRING LITERAL */
                 );
  }
  bVar2 = this[10];
  if ((byte)bVar2 < i) {
    __assert_fail("i <= finish()",
                  "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O3/_deps/absl-src/absl/container/internal/btree.h"
                  ,0x70a,
                  "void absl::container_internal::btree_node<absl::container_internal::map_params<std::basic_string<char>, const google::protobuf::FileDescriptorProto *, std::less<std::basic_string<char>>, std::allocator<std::pair<const std::basic_string<char>, const google::protobuf::FileDescriptorProto *>>, 256, false>>::emplace_value(const field_type, allocator_type *, Args &&...) [Params = absl::container_internal::map_params<std::basic_string<char>, const google::protobuf::FileDescriptorProto *, std::less<std::basic_string<char>>, std::allocator<std::pair<const std::basic_string<char>, const google::protobuf::FileDescriptorProto *>>, 256, false>, Args = <std::pair<const std::basic_string<char>, const google::protobuf::FileDescriptorProto *>>]"
                 );
  }
  iVar4 = (int)CONCAT71(in_register_00000031,i);
  if (i < (byte)bVar2) {
    btree_node<absl::lts_20240722::container_internal::map_params<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_google::protobuf::FileDescriptorProto_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_google::protobuf::FileDescriptorProto_*>_>,_256,_false>_>
    ::transfer_n_backward
              ((btree_node<absl::lts_20240722::container_internal::map_params<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_google::protobuf::FileDescriptorProto_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_google::protobuf::FileDescriptorProto_*>_>,_256,_false>_>
                *)this,(long)(int)((uint)(byte)bVar2 - iVar4),(ulong)(iVar4 + 1),(ulong)i,
               (btree_node<absl::lts_20240722::container_internal::map_params<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_google::protobuf::FileDescriptorProto_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_google::protobuf::FileDescriptorProto_*>_>,_256,_false>_>
                *)this,alloc);
  }
  value_init<std::pair<std::__cxx11::string_const,google::protobuf::FileDescriptorProto_const*>>
            (this,i,alloc,args);
  uVar3 = (uint)(byte)this[10];
  bVar2 = (btree_node<absl::lts_20240722::container_internal::map_params<std::__cxx11::string,google::protobuf::FileDescriptorProto_const*,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,google::protobuf::FileDescriptorProto_const*>>,256,false>>
           )((char)this[10] + 1);
  this[10] = bVar2;
  if ((this[0xb] ==
       (btree_node<absl::lts_20240722::container_internal::map_params<std::__cxx11::string,google::protobuf::FileDescriptorProto_const*,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,google::protobuf::FileDescriptorProto_const*>>,256,false>>
        )0x0) && (uVar5 = iVar4 + 1, uVar5 < (byte)bVar2)) {
    do {
      uVar6 = uVar3 & 0xff;
      c = btree_node<absl::lts_20240722::container_internal::map_params<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_google::protobuf::FileDescriptorProto_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_google::protobuf::FileDescriptorProto_*>_>,_256,_false>_>
          ::child((btree_node<absl::lts_20240722::container_internal::map_params<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_google::protobuf::FileDescriptorProto_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_google::protobuf::FileDescriptorProto_*>_>,_256,_false>_>
                   *)this,(field_type)uVar3);
      btree_node<absl::lts_20240722::container_internal::map_params<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_google::protobuf::FileDescriptorProto_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_google::protobuf::FileDescriptorProto_*>_>,_256,_false>_>
      ::set_child((btree_node<absl::lts_20240722::container_internal::map_params<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_google::protobuf::FileDescriptorProto_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_google::protobuf::FileDescriptorProto_*>_>,_256,_false>_>
                   *)this,(field_type)uVar3 + '\x01',c);
      uVar3 = uVar6 - 1;
    } while (uVar5 < uVar6);
    btree_node<absl::lts_20240722::container_internal::map_params<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_google::protobuf::FileDescriptorProto_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_google::protobuf::FileDescriptorProto_*>_>,_256,_false>_>
    ::mutable_child((btree_node<absl::lts_20240722::container_internal::map_params<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_google::protobuf::FileDescriptorProto_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_google::protobuf::FileDescriptorProto_*>_>,_256,_false>_>
                     *)this,(field_type)uVar5);
    return;
  }
  return;
}

Assistant:

inline void btree_node<P>::emplace_value(const field_type i,
                                         allocator_type *alloc,
                                         Args &&...args) {
  assert(i >= start());
  assert(i <= finish());
  // Shift old values to create space for new value and then construct it in
  // place.
  if (i < finish()) {
    transfer_n_backward(finish() - i, /*dest_i=*/i + 1, /*src_i=*/i, this,
                        alloc);
  }
  value_init(static_cast<field_type>(i), alloc, std::forward<Args>(args)...);
  set_finish(finish() + 1);

  if (is_internal() && finish() > i + 1) {
    for (field_type j = finish(); j > i + 1; --j) {
      set_child(j, child(j - 1));
    }
    clear_child(i + 1);
  }
}